

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_reg_alloc_op(TCGContext_conflict9 *s,TCGOp *op)

{
  int iVar1;
  TCGOpDef *pTVar2;
  TCGArg a;
  _Bool _Var3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  TCGArgConstraint *pTVar8;
  TCGTemp *pTVar9;
  byte bVar10;
  uint uVar11;
  int local_134;
  int i2;
  int k2;
  TCGRegSet o_preferred_regs;
  TCGRegSet i_preferred_regs;
  int const_args [16];
  TCGArg new_args [16];
  TCGTemp *ts;
  TCGArgConstraint *arg_ct;
  TCGArg arg;
  TCGReg reg;
  int nb_oargs;
  int nb_iargs;
  int k;
  int i;
  TCGRegSet o_allocated_regs;
  TCGRegSet i_allocated_regs;
  TCGOpDef *def;
  TCGLifeData arg_life;
  TCGOp *op_local;
  TCGContext_conflict9 *s_local;
  
  uVar4 = (ushort)((uint)*(undefined4 *)op >> 0x10);
  pTVar2 = s->tcg_op_defs;
  uVar11 = *(uint *)op & 0xff;
  uVar5 = (uint)pTVar2[uVar11].nb_oargs;
  uVar6 = (uint)pTVar2[uVar11].nb_iargs;
  memcpy(new_args + (long)(int)uVar5 + (long)(int)uVar6 + -1,
         op->args + (long)(int)uVar5 + (long)(int)uVar6,(ulong)pTVar2[uVar11].nb_cargs << 3);
  i = s->reserved_regs;
  k = s->reserved_regs;
  nb_oargs = 0;
  do {
    nb_iargs = uVar5;
    if ((int)uVar6 <= nb_oargs) {
      for (; nb_iargs < (int)(uVar5 + uVar6); nb_iargs = nb_iargs + 1) {
        if (((uint)uVar4 & 4 << ((byte)nb_iargs & 0x1f)) != 0) {
          pTVar9 = arg_temp(op->args[nb_iargs]);
          temp_dead(s,pTVar9);
        }
      }
      if ((pTVar2[uVar11].flags & 2) == 0) {
        if ((pTVar2[uVar11].flags & 4) != 0) {
          for (nb_iargs = 0; nb_iargs < 0x20; nb_iargs = nb_iargs + 1) {
            if ((s->tcg_target_call_clobber_regs >> ((byte)nb_iargs & 0x1f) & 1) != 0) {
              tcg_reg_free(s,nb_iargs,i);
            }
          }
        }
        if ((pTVar2[uVar11].flags & 8) != 0) {
          sync_globals(s,i);
        }
        for (nb_oargs = 0; nb_oargs < (int)uVar5; nb_oargs = nb_oargs + 1) {
          iVar1 = pTVar2[uVar11].sorted_args[nb_oargs];
          pTVar8 = pTVar2[uVar11].args_ct + iVar1;
          pTVar9 = arg_temp(op->args[iVar1]);
          if (((pTVar8->ct & 0x80) == 0) || ((&o_preferred_regs)[pTVar8->alias_index] != 0)) {
            if ((pTVar8->ct & 0x20) == 0) {
              arg._4_4_ = tcg_reg_alloc(s,(pTVar8->u).regs,k,op->output_pref[nb_oargs],
                                        (*(ulong *)pTVar9 >> 0x22 & 1) != 0);
            }
            else {
              arg._4_4_ = tcg_reg_alloc(s,(pTVar8->u).regs,i | k,op->output_pref[nb_oargs],
                                        (*(ulong *)pTVar9 >> 0x22 & 1) != 0);
            }
          }
          else {
            arg._4_4_ = (TCGReg)new_args[(ulong)pTVar8->alias_index - 1];
          }
          k = 1 << ((byte)arg._4_4_ & 0x1f) | k;
          if (((uint)((ulong)*(undefined8 *)pTVar9 >> 8) & 0xff) == 1) {
            s->reg_to_temp[(uint)*(undefined8 *)pTVar9 & 0xff] = (TCGTemp *)0x0;
          }
          *(ulong *)pTVar9 = *(ulong *)pTVar9 & 0xffffffffffff00ff | 0x100;
          *(ulong *)pTVar9 = *(ulong *)pTVar9 & 0xffffffffffffff00 | (ulong)arg._4_4_ & 0xff;
          *(ulong *)pTVar9 = *(ulong *)pTVar9 & 0xfffffff7ffffffff;
          s->reg_to_temp[arg._4_4_] = pTVar9;
          new_args[(long)iVar1 + -1] = (ulong)arg._4_4_;
        }
      }
      else {
        tcg_reg_alloc_bb_end(s,i);
      }
      if ((pTVar2[uVar11].flags & 0x40) == 0) {
        tcg_out_op(s,*(TCGOpcode *)op & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64),
                   (TCGArg *)(const_args + 0xe),(int *)&o_preferred_regs);
      }
      else {
        tcg_out_vec_op(s,*(TCGOpcode *)op & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64),
                       *(uint *)op >> 8 & 0xf,*(uint *)op >> 0xc & 0xf,(TCGArg *)(const_args + 0xe),
                       (int *)&o_preferred_regs);
      }
      for (nb_iargs = 0; nb_iargs < (int)uVar5; nb_iargs = nb_iargs + 1) {
        pTVar9 = arg_temp(op->args[nb_iargs]);
        bVar10 = (byte)nb_iargs;
        if (((uint)uVar4 & 1 << (bVar10 & 0x1f)) == 0) {
          if (((uint)uVar4 & 4 << (bVar10 & 0x1f)) != 0) {
            temp_dead(s,pTVar9);
          }
        }
        else {
          temp_sync(s,pTVar9,k,0,(uint)uVar4 & 4 << (bVar10 & 0x1f));
        }
      }
      return;
    }
    iVar1 = pTVar2[uVar11].sorted_args[(int)(uVar5 + nb_oargs)];
    a = op->args[iVar1];
    pTVar8 = pTVar2[uVar11].args_ct + iVar1;
    pTVar9 = arg_temp(a);
    if ((((uint)((ulong)*(undefined8 *)pTVar9 >> 8) & 0xff) == 3) &&
       (iVar7 = tcg_target_const_match
                          (pTVar9->val,
                           (TCGType_conflict)((ulong)*(undefined8 *)pTVar9 >> 0x18) & 0xff,pTVar8),
       iVar7 != 0)) {
      (&o_preferred_regs)[iVar1] = 1;
      new_args[(long)iVar1 + -1] = pTVar9->val;
    }
    else {
      i2 = 0;
      k2 = 0;
      if ((pTVar8->ct & 0x40) == 0) {
LAB_012d86d0:
        temp_load(s,pTVar9,(pTVar8->u).regs,i,k2);
        arg._4_4_ = (TCGReg)*(undefined8 *)pTVar9 & 0xff;
        if (((pTVar8->u).regs >> ((byte)*(undefined8 *)pTVar9 & 0x1f) & 1) == 0) goto LAB_012d8719;
      }
      else {
        i2 = op->output_pref[pTVar8->alias_index];
        if ((*(ulong *)pTVar9 >> 0x20 & 1) == 0) {
          if (((uint)uVar4 & 4 << ((byte)iVar1 & 0x1f)) != 0) {
            k2 = i2;
            if (((uint)((ulong)*(undefined8 *)pTVar9 >> 8) & 0xff) == 1) {
              for (local_134 = 0; local_134 < nb_oargs; local_134 = local_134 + 1) {
                if (((pTVar2[uVar11].args_ct[pTVar2[uVar11].sorted_args[(int)(uVar5 + local_134)]].
                      ct & 0x40) != 0) &&
                   ((ulong)((uint)*(undefined8 *)pTVar9 & 0xff) ==
                    new_args[(long)pTVar2[uVar11].sorted_args[(int)(uVar5 + local_134)] + -1]))
                goto LAB_012d8719;
              }
            }
            goto LAB_012d86d0;
          }
        }
        else if (a == op->args[pTVar8->alias_index]) goto LAB_012d86d0;
LAB_012d8719:
        temp_load(s,pTVar9,s->tcg_target_available_regs
                           [(uint)((ulong)*(undefined8 *)pTVar9 >> 0x18) & 0xff],i,0);
        arg._4_4_ = tcg_reg_alloc(s,(pTVar8->u).regs,i,i2,(*(ulong *)pTVar9 >> 0x22 & 1) != 0);
        _Var3 = tcg_out_mov(s,(TCGType_conflict)((ulong)*(undefined8 *)pTVar9 >> 0x18) & 0xff,
                            arg._4_4_,(TCGReg)*(undefined8 *)pTVar9 & 0xff);
        if (!_Var3) {
          temp_sync(s,pTVar9,i,0,0);
          tcg_out_ld(s,(TCGType_conflict)((ulong)*(undefined8 *)pTVar9 >> 0x18) & 0xff,arg._4_4_,
                     (TCGReg)*(undefined8 *)pTVar9->mem_base & 0xff,pTVar9->mem_offset);
        }
      }
      new_args[(long)iVar1 + -1] = (ulong)arg._4_4_;
      (&o_preferred_regs)[iVar1] = 0;
      i = 1 << ((byte)arg._4_4_ & 0x1f) | i;
    }
    nb_oargs = nb_oargs + 1;
  } while( true );
}

Assistant:

static void tcg_reg_alloc_op(TCGContext *s, const TCGOp *op)
{
    const TCGLifeData arg_life = op->life;
    const TCGOpDef * const def = &s->tcg_op_defs[op->opc];
    TCGRegSet i_allocated_regs;
    TCGRegSet o_allocated_regs;
    int i, k, nb_iargs, nb_oargs;
    TCGReg reg;
    TCGArg arg;
    const TCGArgConstraint *arg_ct;
    TCGTemp *ts;
    TCGArg new_args[TCG_MAX_OP_ARGS];
    int const_args[TCG_MAX_OP_ARGS];

    nb_oargs = def->nb_oargs;
    nb_iargs = def->nb_iargs;

    /* copy constants */
    memcpy(new_args + nb_oargs + nb_iargs, 
           op->args + nb_oargs + nb_iargs,
           sizeof(TCGArg) * def->nb_cargs);

    i_allocated_regs = s->reserved_regs;
    o_allocated_regs = s->reserved_regs;

    /* satisfy input constraints */ 
    for (k = 0; k < nb_iargs; k++) {
        TCGRegSet i_preferred_regs, o_preferred_regs;

        i = def->sorted_args[nb_oargs + k];
        arg = op->args[i];
        arg_ct = &def->args_ct[i];
        ts = arg_temp(arg);

        if (ts->val_type == TEMP_VAL_CONST
            && tcg_target_const_match(ts->val, ts->type, arg_ct)) {
            /* constant is OK for instruction */
            const_args[i] = 1;
            new_args[i] = ts->val;
            continue;
        }

        i_preferred_regs = o_preferred_regs = 0;
        if (arg_ct->ct & TCG_CT_IALIAS) {
            o_preferred_regs = op->output_pref[arg_ct->alias_index];
            if (ts->fixed_reg) {
                /* if fixed register, we must allocate a new register
                   if the alias is not the same register */
                if (arg != op->args[arg_ct->alias_index]) {
                    goto allocate_in_reg;
                }
            } else {
                /* if the input is aliased to an output and if it is
                   not dead after the instruction, we must allocate
                   a new register and move it */
                if (!IS_DEAD_ARG(i)) {
                    goto allocate_in_reg;
                }

                /* check if the current register has already been allocated
                   for another input aliased to an output */
                if (ts->val_type == TEMP_VAL_REG) {
                    int k2, i2;
                    reg = ts->reg;
                    for (k2 = 0 ; k2 < k ; k2++) {
                        i2 = def->sorted_args[nb_oargs + k2];
                        if ((def->args_ct[i2].ct & TCG_CT_IALIAS) &&
                            reg == new_args[i2]) {
                            goto allocate_in_reg;
                        }
                    }
                }
                i_preferred_regs = o_preferred_regs;
            }
        }

        temp_load(s, ts, arg_ct->u.regs, i_allocated_regs, i_preferred_regs);
        reg = ts->reg;

        if (tcg_regset_test_reg(arg_ct->u.regs, reg)) {
            /* nothing to do : the constraint is satisfied */
        } else {
        allocate_in_reg:
            /* allocate a new register matching the constraint 
               and move the temporary register into it */
            temp_load(s, ts, s->tcg_target_available_regs[ts->type],
                      i_allocated_regs, 0);
            reg = tcg_reg_alloc(s, arg_ct->u.regs, i_allocated_regs,
                                o_preferred_regs, ts->indirect_base);
            if (!tcg_out_mov(s, ts->type, reg, ts->reg)) {
                /*
                 * Cross register class move not supported.  Sync the
                 * temp back to its slot and load from there.
                 */
                temp_sync(s, ts, i_allocated_regs, 0, 0);
                tcg_out_ld(s, ts->type, reg,
                           ts->mem_base->reg, ts->mem_offset);
            }
        }
        new_args[i] = reg;
        const_args[i] = 0;
        tcg_regset_set_reg(i_allocated_regs, reg);
    }
    
    /* mark dead temporaries and free the associated registers */
    for (i = nb_oargs; i < nb_oargs + nb_iargs; i++) {
        if (IS_DEAD_ARG(i)) {
            temp_dead(s, arg_temp(op->args[i]));
        }
    }

    if (def->flags & TCG_OPF_BB_END) {
        tcg_reg_alloc_bb_end(s, i_allocated_regs);
    } else {
        if (def->flags & TCG_OPF_CALL_CLOBBER) {
            /* XXX: permit generic clobber register list ? */ 
            for (i = 0; i < TCG_TARGET_NB_REGS; i++) {
                if (tcg_regset_test_reg(s->tcg_target_call_clobber_regs, i)) {
                    tcg_reg_free(s, i, i_allocated_regs);
                }
            }
        }
        if (def->flags & TCG_OPF_SIDE_EFFECTS) {
            /* sync globals if the op has side effects and might trigger
               an exception. */
            sync_globals(s, i_allocated_regs);
        }
        
        /* satisfy the output constraints */
        for(k = 0; k < nb_oargs; k++) {
            i = def->sorted_args[k];
            arg = op->args[i];
            arg_ct = &def->args_ct[i];
            ts = arg_temp(arg);

            /* ENV should not be modified.  */
            tcg_debug_assert(!ts->fixed_reg);

            if ((arg_ct->ct & TCG_CT_ALIAS)
                && !const_args[arg_ct->alias_index]) {
                reg = new_args[arg_ct->alias_index];
            } else if (arg_ct->ct & TCG_CT_NEWREG) {
                reg = tcg_reg_alloc(s, arg_ct->u.regs,
                                    i_allocated_regs | o_allocated_regs,
                                    op->output_pref[k], ts->indirect_base);
            } else {
                reg = tcg_reg_alloc(s, arg_ct->u.regs, o_allocated_regs,
                                    op->output_pref[k], ts->indirect_base);
            }
            tcg_regset_set_reg(o_allocated_regs, reg);
            if (ts->val_type == TEMP_VAL_REG) {
                s->reg_to_temp[ts->reg] = NULL;
            }
            ts->val_type = TEMP_VAL_REG;
            ts->reg = reg;
            /*
             * Temp value is modified, so the value kept in memory is
             * potentially not the same.
             */
            ts->mem_coherent = 0;
            s->reg_to_temp[reg] = ts;
            new_args[i] = reg;
        }
    }

    /* emit instruction */
    if (def->flags & TCG_OPF_VECTOR) {
        tcg_out_vec_op(s, op->opc, TCGOP_VECL(op), TCGOP_VECE(op),
                       new_args, const_args);
    } else {
        tcg_out_op(s, op->opc, new_args, const_args);
    }

    /* move the outputs in the correct register if needed */
    for(i = 0; i < nb_oargs; i++) {
        ts = arg_temp(op->args[i]);

        /* ENV should not be modified.  */
        tcg_debug_assert(!ts->fixed_reg);

        if (NEED_SYNC_ARG(i)) {
            temp_sync(s, ts, o_allocated_regs, 0, IS_DEAD_ARG(i));
        } else if (IS_DEAD_ARG(i)) {
            temp_dead(s, ts);
        }
    }
}